

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
::init<Kernel::Literal*,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
          (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
           *this,SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed,AbstractingUnifier *args,
          AbstractionOracle args_1,bool args_2)

{
  anon_class_8_1_8991fb9c bindSpecialVar;
  ulong uVar1;
  undefined8 uVar2;
  bool reversed_00;
  byte bVar3;
  byte bVar4;
  UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  *in_RCX;
  byte bVar5;
  long in_RDX;
  long in_RSI;
  UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  *in_RDI;
  byte in_R8B;
  undefined4 in_R9D;
  Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *unaff_retaddr;
  EVP_PKEY_CTX *in_stack_00000008;
  undefined4 in_stack_00000010;
  byte in_stack_00000018;
  undefined4 in_stack_ffffffffffffff78;
  InstanceCntr local_55 [20];
  Literal *lit;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd4;
  UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  *pUVar6;
  undefined1 backtrackable;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 uVar7;
  
  bVar5 = in_R8B & 1;
  bVar4 = (byte)in_R9D & 1;
  bVar3 = in_stack_00000018 & 1;
  pUVar6 = in_RDI;
  uVar7 = in_stack_00000010;
  RetrievalAlgorithms::
  UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  ::init(in_RDI,in_stack_00000008);
  backtrackable = (undefined1)((ulong)pUVar6 >> 0x38);
  *(byte *)&in_RDI[3]._unif = bVar5 & 1;
  stack0xffffffffffffffb8 = 0;
  lit = (Literal *)0x0;
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>::Option
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_> *)
             0x43fe1d);
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>::operator=
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_> *)
             in_RCX,(Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>
                     *)CONCAT44(in_R9D,in_stack_ffffffffffffff78));
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>::~Option
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_> *)
             0x43fe3c);
  *(undefined1 *)&in_RDI[9]._unif = 0;
  InstanceCntr::InstanceCntr(local_55,(Cntr *)(in_RSI + 0x10));
  if (in_RDX != 0) {
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
    ::bdRecord(in_RCX,(BacktrackData *)CONCAT44(in_R9D,in_stack_ffffffffffffff78));
    uVar2 = stack0xffffffffffffffb8;
    uVar1 = (ulong)stack0xffffffffffffffb8 >> 0x38;
    reversed_00 = SUB81(uVar1,0);
    bindSpecialVar.this._4_1_ = in_stack_ffffffffffffffd4;
    bindSpecialVar.this._0_4_ = in_stack_00000010;
    bindSpecialVar.this._5_1_ = bVar3;
    bindSpecialVar.this._6_1_ = bVar4;
    bindSpecialVar.this._7_1_ = bVar5;
    unique0x10000201 = uVar2;
    createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>::init<Kernel::Literal*,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>(Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node*,Kernel::Literal*,bool,bool,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool)::_lambda(unsigned_int,Kernel::TermList)_1_>
              (in_stack_ffffffffffffffc8,lit,reversed_00,bindSpecialVar);
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
    ::bdDone((UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
              *)0x43fec1);
    Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
    ::prepareChildren(unaff_retaddr,(Node *)CONCAT44(uVar7,in_stack_fffffffffffffff8),
                      (bool)backtrackable);
  }
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args) {
        _algo.init(std::move(args)...);
        _retrieveSubstitution = retrieveSubstitution;
        _leafData = {};
        _normalizationRecording = false;
        _iterCntr = InstanceCntr(parent->_iterCnt);

#define DEBUG_QUERY(lvl, ...) if (lvl < 0) DBG(__VA_ARGS__)
        if(!root) {
          return;
        }

        _algo.bdRecord(_queryInitBacktrackData);
        parent->createBindings(query, reversed, 
            [&](unsigned var, TermList t) { _algo.bindQuerySpecialVar(var, t); });
        DEBUG_QUERY(1, "query: ", _algo)
        _algo.bdDone();


        prepareChildren(root, /* backtrackable */ false);
      }